

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O3

Gia_Man_t * Cec_ManCombSpecReduce(Gia_Man_t *p,Vec_Int_t **pvOutputs,int fRings)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  ulong uVar14;
  long lVar15;
  Gia_Obj_t *pGVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint local_6c;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecChoice.c"
                  ,0x66,"Gia_Man_t *Cec_ManCombSpecReduce(Gia_Man_t *, Vec_Int_t **, int)");
  }
  Gia_ManSetPhase(p);
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_005c919c;
      pGVar16 = p->pObjs;
      if (pGVar16 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar20 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar20 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar20 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar12 = p_00->pObjs;
      if ((pGVar9 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar9)) goto LAB_005c91bb;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * -0x55555555);
      pGVar12 = p_00->pObjs;
      if ((pGVar9 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar9)) goto LAB_005c91bb;
      pGVar16[iVar6].Value = (int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar10 = p->vCis;
    } while (lVar15 < pVVar10->nSize);
  }
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar10->pArray = piVar11;
  *pvOutputs = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar10->pArray = piVar11;
  uVar3 = p->nObjs;
  uVar20 = (ulong)uVar3;
  if (fRings == 0) {
    if ((int)uVar3 < 2) goto LAB_005c8fd7;
    lVar15 = 1;
    lVar19 = 0xc;
    do {
      uVar14 = (ulong)(uint)p->pReprs[lVar15] & 0xfffffff;
      if (uVar14 != 0xfffffff) {
        if ((uint)uVar20 <= (uint)uVar14) goto LAB_005c919c;
        pGVar16 = p->pObjs;
        if (pGVar16 != (Gia_Obj_t *)0x0) {
          pGVar12 = pGVar16 + uVar14;
          if ((uint)uVar14 == 0) {
            local_6c = 0;
          }
          else {
            local_6c = Cec_ManCombSpecReal(p_00,p,pGVar12);
          }
          pGVar9 = (Gia_Obj_t *)(&pGVar16->field_0x0 + lVar19);
          uVar3 = Cec_ManCombSpecReal(p_00,p,pGVar9);
          if ((int)uVar3 < 0) goto LAB_005c91da;
          uVar3 = uVar3 ^ ((uint)((ulong)*(undefined8 *)pGVar12 >> 0x20) ^
                          (uint)((ulong)*(undefined8 *)pGVar9 >> 0x20)) >> 0x1f;
          if (local_6c != uVar3) {
            pGVar2 = p->pObjs;
            if ((pGVar12 < pGVar2) || (pGVar2 + p->nObjs <= pGVar12)) goto LAB_005c91bb;
            Vec_IntPush(*pvOutputs,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
            pGVar12 = p->pObjs;
            if ((pGVar9 < pGVar12) || (pGVar12 + p->nObjs <= pGVar9)) goto LAB_005c91bb;
            Vec_IntPush(*pvOutputs,
                        (int)((ulong)((long)pGVar16 + (lVar19 - (long)pGVar12)) >> 2) * -0x55555555)
            ;
            iVar6 = Gia_ManHashXor(p_00,local_6c,uVar3);
            Vec_IntPush(pVVar10,iVar6);
          }
        }
      }
      lVar15 = lVar15 + 1;
      uVar20 = (ulong)p->nObjs;
      lVar19 = lVar19 + 0xc;
    } while (lVar15 < (long)uVar20);
  }
  else {
    if ((int)uVar3 < 2) goto LAB_005c8fd7;
    uVar20 = 1;
    do {
      pGVar16 = p->pObjs + uVar20;
      uVar3 = (uint)p->pReprs[uVar20] & 0xfffffff;
      if (uVar3 == 0xfffffff) {
        if (0 < p->pNexts[uVar20]) {
          uVar14 = uVar20 & 0xffffffff;
          uVar3 = p->pNexts[uVar20];
          do {
            uVar18 = uVar3;
            iVar6 = (int)uVar14;
            if (((p->nObjs <= iVar6) ||
                (uVar3 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar14), (int)uVar18 < 0)) ||
               (p->nObjs <= (int)uVar18)) goto LAB_005c919c;
            uVar4 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar18);
            if (p->nObjs <= iVar6) goto LAB_005c919c;
            if ((int)uVar3 < 0) goto LAB_005c91da;
            if ((uint)p->nObjs <= uVar18) goto LAB_005c919c;
            if ((int)uVar4 < 0) goto LAB_005c91da;
            uVar5 = (uint)((ulong)*(undefined8 *)pGVar16 >> 0x20);
            uVar4 = uVar4 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar18) >> 0x20) ^ uVar5) >>
                            0x1f;
            if (((uVar4 != 1) &&
                (uVar5 = -((int)(uVar5 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar14) >> 0x20))
                          >> 0x1f), uVar3 != uVar5)) && (uVar3 = uVar3 ^ uVar5, uVar3 != uVar4)) {
              Vec_IntPush(*pvOutputs,iVar6);
              Vec_IntPush(*pvOutputs,uVar18);
              iVar6 = Gia_ManHashAnd(p_00,uVar3,uVar4 ^ 1);
              Vec_IntPush(pVVar10,iVar6);
            }
            uVar14 = (ulong)uVar18;
            uVar3 = p->pNexts[uVar18];
          } while (p->pNexts[uVar18] != 0);
          if ((p->nObjs <= (int)uVar18) ||
             (uVar3 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar18), (long)p->nObjs <= (long)uVar20)
             ) {
LAB_005c919c:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar4 = Cec_ManCombSpecReal(p_00,p,p->pObjs + uVar20);
          if (p->nObjs <= (int)uVar18) goto LAB_005c919c;
          if ((int)uVar3 < 0) {
LAB_005c91da:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          if ((long)p->nObjs <= (long)uVar20) goto LAB_005c919c;
          if ((int)uVar4 < 0) goto LAB_005c91da;
          uVar5 = (uint)((ulong)*(undefined8 *)pGVar16 >> 0x20);
          uVar4 = uVar4 ^ ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar20) >> 0x20) ^ uVar5) >>
                          0x1f;
          if (((uVar4 != 1) &&
              (uVar5 = -((int)(uVar5 ^ (uint)((ulong)*(undefined8 *)(p->pObjs + uVar18) >> 0x20)) >>
                        0x1f), uVar3 != uVar5)) && (uVar3 = uVar3 ^ uVar5, uVar3 != uVar4)) {
            Vec_IntPush(*pvOutputs,uVar18);
            Vec_IntPush(*pvOutputs,(int)uVar20);
            uVar3 = Gia_ManHashAnd(p_00,uVar3,uVar4 ^ 1);
            goto LAB_005c8e33;
          }
        }
      }
      else if (uVar3 == 0) {
        uVar3 = Cec_ManCombSpecReal(p_00,p,pGVar16);
        if ((int)uVar3 < 0) goto LAB_005c91da;
        uVar18 = -(int)((long)*(undefined8 *)pGVar16 >> 0x3f);
        if (uVar3 != uVar18) {
          uVar3 = uVar3 ^ uVar18;
          Vec_IntPush(*pvOutputs,0);
          Vec_IntPush(*pvOutputs,(int)uVar20);
LAB_005c8e33:
          Vec_IntPush(pVVar10,uVar3);
        }
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)p->nObjs);
  }
  piVar11 = pVVar10->pArray;
LAB_005c8fd7:
  iVar6 = pVVar10->nSize;
  if (0 < (long)iVar6) {
    lVar15 = 0;
    do {
      uVar3 = piVar11[lVar15];
      if ((int)uVar3 < 0) {
LAB_005c91f9:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar18 = uVar3 >> 1;
      if (p_00->nObjs <= (int)uVar18) goto LAB_005c91f9;
      if ((~*(uint *)(p_00->pObjs + uVar18) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar18) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar20 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar20 | 0x80000000;
      pGVar16 = p_00->pObjs;
      if ((pGVar12 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar12)) {
LAB_005c91bb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (ulong)(((uint)((int)pGVar12 - (int)pGVar16) >> 2) * -0x55555555 - uVar18 &
                      0x1fffffff);
      uVar17 = (ulong)((uVar3 & 1) << 0x1d);
      *(ulong *)pGVar12 = uVar17 | uVar20 & 0xffffffffc0000000 | 0x80000000 | uVar14;
      *(ulong *)pGVar12 =
           uVar17 | uVar20 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar16 = p_00->pObjs;
      if ((pGVar12 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar12)) goto LAB_005c91bb;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar12 - (long)pGVar16) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff),pGVar12)
        ;
      }
      if ((pGVar12 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar12)) goto LAB_005c91bb;
      lVar15 = lVar15 + 1;
    } while (iVar6 != lVar15);
  }
  if (piVar11 != (int *)0x0) {
    free(piVar11);
  }
  free(pVVar10);
  Gia_ManHashStop(p_00);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Cec_ManCombSpecReduce( Gia_Man_t * p, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int i, iPrev, iObj, iPrevNew, iObjNew;
    assert( p->pReprs != NULL );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Cec_ManCombSpecReal( pNew, p, pObj );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                    iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iPrev) );
                iObjNew  = Cec_ManCombSpecReal( pNew, p, Gia_ManObj(p, iObj) );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Cec_ManCombSpecReal( pNew, p, pRepr );
            iObjNew  = Cec_ManCombSpecReal( pNew, p, pObj );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}